

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O1

int nonce_function_dleq(uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16)

{
  bool bVar1;
  uint uVar2;
  secp256k1_sha256 sha;
  secp256k1_sha256 sStack_88;
  
  if (algo16 == (uchar *)0x0) {
    return 0;
  }
  uVar2 = 0x10;
  do {
    if (algo16[(ulong)uVar2 - 1] != '\0') goto LAB_004edbe6;
    bVar1 = 1 < uVar2;
    uVar2 = uVar2 - 1;
  } while (bVar1);
  uVar2 = 0;
LAB_004edbe6:
  secp256k1_sha256_initialize_tagged(&sStack_88,algo16,(long)(int)uVar2);
  secp256k1_sha256_write(&sStack_88,key32,0x20);
  secp256k1_sha256_write(&sStack_88,msg32,0x20);
  secp256k1_sha256_finalize(&sStack_88,nonce32);
  return 1;
}

Assistant:

static int nonce_function_dleq(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16) {
    secp256k1_sha256 sha;

    if (algo16 == NULL) {
        return 0;
    }
    secp256k1_sha256_initialize_tagged(&sha, algo16, algo16_len(algo16));
    secp256k1_sha256_write(&sha, key32, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, nonce32);
    return 1;
}